

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_1.c
# Opt level: O2

void amd_l1(longlong n,longlong *Ap,longlong *Ai,longlong *P,longlong *Pinv,longlong *Len,
           longlong slen,longlong *S,c_float *Control,c_float *Info)

{
  longlong *Nv;
  longlong *Head;
  longlong *Elen;
  longlong *W;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  longlong *Iw;
  longlong pfree;
  longlong lVar7;
  longlong lVar8;
  long lVar9;
  
  Nv = S + n;
  Head = Nv + n;
  pfree = 0;
  lVar9 = 0;
  if (0 < n) {
    lVar9 = n;
  }
  Elen = Head + n;
  W = Elen + n + n;
  for (lVar5 = 0; lVar9 != lVar5; lVar5 = lVar5 + 1) {
    S[lVar5] = pfree;
    Nv[lVar5] = pfree;
    pfree = pfree + Len[lVar5];
  }
  Iw = W + n;
  lVar5 = 0;
  do {
    if (lVar5 == lVar9) {
      lVar5 = 0;
      while (lVar6 = lVar5, lVar6 != lVar9) {
        for (lVar7 = W[lVar6]; lVar5 = lVar6 + 1, lVar7 < Ap[lVar6 + 1]; lVar7 = lVar7 + 1) {
          lVar5 = Ai[lVar7];
          lVar1 = Nv[lVar5];
          Nv[lVar5] = lVar1 + 1;
          Iw[lVar1] = lVar6;
          lVar1 = Nv[lVar6];
          Nv[lVar6] = lVar1 + 1;
          Iw[lVar1] = lVar5;
        }
      }
      amd_l2(n,S,Iw,Len,n * -6 + slen,pfree,Nv,Pinv,P,Head,Elen,Elen + n,W,Control,Info);
      return;
    }
    lVar7 = Ap[lVar5];
    lVar6 = Ap[lVar5 + 1];
    while (lVar7 < lVar6) {
      lVar1 = Ai[lVar7];
      if (lVar5 <= lVar1) {
        lVar7 = lVar7 + (ulong)(lVar1 == lVar5);
        break;
      }
      lVar2 = Nv[lVar1];
      Nv[lVar1] = lVar2 + 1;
      Iw[lVar2] = lVar5;
      lVar2 = Nv[lVar5];
      Nv[lVar5] = lVar2 + 1;
      Iw[lVar2] = lVar1;
      lVar7 = lVar7 + 1;
      lVar2 = Ap[lVar1 + 1];
      for (lVar8 = W[lVar1]; lVar8 < lVar2; lVar8 = lVar8 + 1) {
        lVar3 = Ai[lVar8];
        if (lVar5 <= lVar3) {
          lVar8 = lVar8 + (ulong)(lVar3 == lVar5);
          break;
        }
        lVar4 = Nv[lVar3];
        Nv[lVar3] = lVar4 + 1;
        Iw[lVar4] = lVar1;
        lVar4 = Nv[lVar1];
        Nv[lVar1] = lVar4 + 1;
        Iw[lVar4] = lVar3;
      }
      W[lVar1] = lVar8;
    }
    W[lVar5] = lVar7;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

GLOBAL void AMD_1
(
    Int n,		/* n > 0 */
    const Int Ap [ ],	/* input of size n+1, not modified */
    const Int Ai [ ],	/* input of size nz = Ap [n], not modified */
    Int P [ ],		/* size n output permutation */
    Int Pinv [ ],	/* size n output inverse permutation */
    Int Len [ ],	/* size n input, undefined on output */
    Int slen,		/* slen >= sum (Len [0..n-1]) + 7n,
			 * ideally slen = 1.2 * sum (Len) + 8n */
    Int S [ ],		/* size slen workspace */
    c_float Control [ ],	/* input array of size AMD_CONTROL */
    c_float Info [ ]	/* output array of size AMD_INFO */
)
{
    Int i, j, k, p, pfree, iwlen, pj, p1, p2, pj2, *Iw, *Pe, *Nv, *Head,
	*Elen, *Degree, *s, *W, *Sp, *Tp ;

    /* --------------------------------------------------------------------- */
    /* construct the matrix for AMD_2 */
    /* --------------------------------------------------------------------- */

    ASSERT (n > 0) ;

    iwlen = slen - 6*n ;
    s = S ;
    Pe = s ;	    s += n ;
    Nv = s ;	    s += n ;
    Head = s ;	    s += n ;
    Elen = s ;	    s += n ;
    Degree = s ;    s += n ;
    W = s ;	    s += n ;
    Iw = s ;	    s += iwlen ;

    ASSERT (AMD_valid (n, n, Ap, Ai) == AMD_OK) ;

    /* construct the pointers for A+A' */
    Sp = Nv ;			/* use Nv and W as workspace for Sp and Tp [ */
    Tp = W ;
    pfree = 0 ;
    for (j = 0 ; j < n ; j++)
    {
	Pe [j] = pfree ;
	Sp [j] = pfree ;
	pfree += Len [j] ;
    }

    /* Note that this restriction on iwlen is slightly more restrictive than
     * what is strictly required in AMD_2.  AMD_2 can operate with no elbow
     * room at all, but it will be very slow.  For better performance, at
     * least size-n elbow room is enforced. */
    ASSERT (iwlen >= pfree + n) ;

#ifndef NDEBUG
    for (p = 0 ; p < iwlen ; p++) Iw [p] = EMPTY ;
#endif

    for (k = 0 ; k < n ; k++)
    {
	AMD_DEBUG1 (("Construct row/column k= "ID" of A+A'\n", k))  ;
	p1 = Ap [k] ;
	p2 = Ap [k+1] ;

	/* construct A+A' */
	for (p = p1 ; p < p2 ; )
	{
	    /* scan the upper triangular part of A */
	    j = Ai [p] ;
	    ASSERT (j >= 0 && j < n) ;
	    if (j < k)
	    {
		/* entry A (j,k) in the strictly upper triangular part */
		ASSERT (Sp [j] < (j == n-1 ? pfree : Pe [j+1])) ;
		ASSERT (Sp [k] < (k == n-1 ? pfree : Pe [k+1])) ;
		Iw [Sp [j]++] = k ;
		Iw [Sp [k]++] = j ;
		p++ ;
	    }
	    else if (j == k)
	    {
		/* skip the diagonal */
		p++ ;
		break ;
	    }
	    else /* j > k */
	    {
		/* first entry below the diagonal */
		break ;
	    }
	    /* scan lower triangular part of A, in column j until reaching
	     * row k.  Start where last scan left off. */
	    ASSERT (Ap [j] <= Tp [j] && Tp [j] <= Ap [j+1]) ;
	    pj2 = Ap [j+1] ;
	    for (pj = Tp [j] ; pj < pj2 ; )
	    {
		i = Ai [pj] ;
		ASSERT (i >= 0 && i < n) ;
		if (i < k)
		{
		    /* A (i,j) is only in the lower part, not in upper */
		    ASSERT (Sp [i] < (i == n-1 ? pfree : Pe [i+1])) ;
		    ASSERT (Sp [j] < (j == n-1 ? pfree : Pe [j+1])) ;
		    Iw [Sp [i]++] = j ;
		    Iw [Sp [j]++] = i ;
		    pj++ ;
		}
		else if (i == k)
		{
		    /* entry A (k,j) in lower part and A (j,k) in upper */
		    pj++ ;
		    break ;
		}
		else /* i > k */
		{
		    /* consider this entry later, when k advances to i */
		    break ;
		}
	    }
	    Tp [j] = pj ;
	}
	Tp [k] = p ;
    }

    /* clean up, for remaining mismatched entries */
    for (j = 0 ; j < n ; j++)
    {
	for (pj = Tp [j] ; pj < Ap [j+1] ; pj++)
	{
	    i = Ai [pj] ;
	    ASSERT (i >= 0 && i < n) ;
	    /* A (i,j) is only in the lower part, not in upper */
	    ASSERT (Sp [i] < (i == n-1 ? pfree : Pe [i+1])) ;
	    ASSERT (Sp [j] < (j == n-1 ? pfree : Pe [j+1])) ;
	    Iw [Sp [i]++] = j ;
	    Iw [Sp [j]++] = i ;
	}
    }

#ifndef NDEBUG
    for (j = 0 ; j < n-1 ; j++) ASSERT (Sp [j] == Pe [j+1]) ;
    ASSERT (Sp [n-1] == pfree) ;
#endif

    /* Tp and Sp no longer needed ] */

    /* --------------------------------------------------------------------- */
    /* order the matrix */
    /* --------------------------------------------------------------------- */

    AMD_2 (n, Pe, Iw, Len, iwlen, pfree,
	Nv, Pinv, P, Head, Elen, Degree, W, Control, Info) ;
}